

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::WriteDescriptorSet
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files)

{
  char cVar1;
  int iVar2;
  pointer ppFVar3;
  FileDescriptorProto *pFVar4;
  int *piVar5;
  ostream *poVar6;
  char *pcVar7;
  size_t sVar8;
  bool bVar9;
  ulong uVar10;
  FileDescriptorSet file_set;
  FileOutputStream out;
  FileDescriptorSet local_b0 [16];
  RepeatedPtrField<google::protobuf::FileDescriptorProto> local_a0;
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  local_80;
  
  google::protobuf::FileDescriptorSet::FileDescriptorSet(local_b0);
  if (this->imports_in_descriptor_set_ == false) {
    if ((parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish !=
        (parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        if (local_a0.super_RepeatedPtrFieldBase.allocated_size_ <=
            local_a0.super_RepeatedPtrFieldBase.current_size_) {
          if (local_a0.super_RepeatedPtrFieldBase.allocated_size_ ==
              local_a0.super_RepeatedPtrFieldBase.total_size_) {
            google::protobuf::internal::RepeatedPtrFieldBase::Reserve((int)&local_a0);
          }
          local_a0.super_RepeatedPtrFieldBase.allocated_size_ =
               local_a0.super_RepeatedPtrFieldBase.allocated_size_ + 1;
          pFVar4 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
          local_a0.super_RepeatedPtrFieldBase.elements_
          [local_a0.super_RepeatedPtrFieldBase.current_size_] = pFVar4;
        }
        local_a0.super_RepeatedPtrFieldBase.current_size_ =
             local_a0.super_RepeatedPtrFieldBase.current_size_ + 1;
        google::protobuf::FileDescriptor::CopyTo
                  ((FileDescriptorProto *)
                   (parsed_files->
                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start[uVar10]);
        if (this->source_info_in_descriptor_set_ == true) {
          google::protobuf::FileDescriptor::CopySourceCodeInfoTo
                    ((FileDescriptorProto *)
                     (parsed_files->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar10]);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)(parsed_files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                                (long)(parsed_files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  else {
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_80._M_impl.super__Rb_tree_header._M_header;
    local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
    ppFVar3 = (parsed_files->
              super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    local_80._M_impl.super__Rb_tree_header._M_header._M_right =
         local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((parsed_files->
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish != ppFVar3) {
      uVar10 = 0;
      do {
        GetTransitiveDependencies
                  (ppFVar3[uVar10],this->source_info_in_descriptor_set_,
                   (set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                    *)&local_80,&local_a0);
        uVar10 = uVar10 + 1;
        ppFVar3 = (parsed_files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (uVar10 < (ulong)((long)(parsed_files->
                                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 >>
                               3));
    }
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::~_Rb_tree(&local_80);
  }
  do {
    iVar2 = open((this->descriptor_set_name_)._M_dataplus._M_p,0x241,0x1b6);
    if (-1 < iVar2) {
      google::protobuf::io::FileOutputStream::FileOutputStream
                ((FileOutputStream *)&local_80,iVar2,-1);
      cVar1 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                        ((ZeroCopyOutputStream *)local_b0);
      if (cVar1 == '\0') {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                            (this->descriptor_set_name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        pcVar7 = strerror((int)local_80._M_impl.super__Rb_tree_header._M_header._M_left);
        if (pcVar7 == (char *)0x0) {
          std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
        }
        else {
          sVar8 = strlen(pcVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
        }
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        google::protobuf::io::FileOutputStream::Close();
LAB_00136b16:
        bVar9 = false;
      }
      else {
        cVar1 = google::protobuf::io::FileOutputStream::Close();
        bVar9 = true;
        if (cVar1 == '\0') {
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,(this->descriptor_set_name_)._M_dataplus._M_p,
                              (this->descriptor_set_name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          pcVar7 = strerror((int)local_80._M_impl.super__Rb_tree_header._M_header._M_left);
          if (pcVar7 == (char *)0x0) {
            std::ios::clear((int)poVar6 + (int)*(undefined8 *)(*(long *)poVar6 + -0x18));
          }
          else {
            sVar8 = strlen(pcVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar7,sVar8);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
          std::ostream::put((char)poVar6);
          std::ostream::flush();
          goto LAB_00136b16;
        }
      }
      google::protobuf::io::FileOutputStream::~FileOutputStream((FileOutputStream *)&local_80);
      goto LAB_00136b22;
    }
    piVar5 = __errno_location();
  } while (*piVar5 == 4);
  perror((this->descriptor_set_name_)._M_dataplus._M_p);
  bVar9 = false;
LAB_00136b22:
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(local_b0);
  return bVar9;
}

Assistant:

bool CommandLineInterface::WriteDescriptorSet(
    const vector<const FileDescriptor*> parsed_files) {
  FileDescriptorSet file_set;

  if (imports_in_descriptor_set_) {
    set<const FileDescriptor*> already_seen;
    for (int i = 0; i < parsed_files.size(); i++) {
      GetTransitiveDependencies(parsed_files[i],
                                source_info_in_descriptor_set_,
                                &already_seen, file_set.mutable_file());
    }
  } else {
    for (int i = 0; i < parsed_files.size(); i++) {
      FileDescriptorProto* file_proto = file_set.add_file();
      parsed_files[i]->CopyTo(file_proto);
      if (source_info_in_descriptor_set_) {
        parsed_files[i]->CopySourceCodeInfoTo(file_proto);
      }
    }
  }

  int fd;
  do {
    fd = open(descriptor_set_name_.c_str(),
              O_WRONLY | O_CREAT | O_TRUNC | O_BINARY, 0666);
  } while (fd < 0 && errno == EINTR);

  if (fd < 0) {
    perror(descriptor_set_name_.c_str());
    return false;
  }

  io::FileOutputStream out(fd);
  if (!file_set.SerializeToZeroCopyStream(&out)) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    out.Close();
    return false;
  }
  if (!out.Close()) {
    cerr << descriptor_set_name_ << ": " << strerror(out.GetErrno()) << endl;
    return false;
  }

  return true;
}